

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MineFusing.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::MineFusing::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MineFusing *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  MineFusing *local_18;
  MineFusing *this_local;
  
  local_18 = this;
  this_local = (MineFusing *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"MineFusing:");
  poVar1 = std::operator<<(poVar1,"\n\tPrimary Fuse:            ");
  ENUMS::GetEnumAsStringMineFuse_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((this->m_FuseUnion).m_ui16Fusing & 0x7f),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tSecondary Fuse:          ");
  ENUMS::GetEnumAsStringMineFuse_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((this->m_FuseUnion).m_ui16Fusing >> 7 & 0x7f),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tAnti-Handling Device:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_FuseUnion).m_ui16Fusing >> 0xe & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString MineFusing::GetAsString() const
{
    KStringStream ss;

    ss << "MineFusing:"
       << "\n\tPrimary Fuse:            " << GetEnumAsStringMineFuse( m_FuseUnion.m_ui16Primary )
       << "\n\tSecondary Fuse:          " << GetEnumAsStringMineFuse( m_FuseUnion.m_ui16Secondary )
       << "\n\tAnti-Handling Device:    " << m_FuseUnion.m_ui16AHD
       << "\n";

    return ss.str();
}